

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time.cpp
# Opt level: O3

dtime_t duckdb::Time::FromTimeMs(int64_t time_ms)

{
  bool bVar1;
  ConversionException *this;
  int64_t result;
  int64_t local_48;
  string local_40;
  
  bVar1 = TryMultiplyOperator::Operation<long,long,long>(time_ms,1000,&local_48);
  if (bVar1) {
    return (dtime_t)local_48;
  }
  this = (ConversionException *)__cxa_allocate_exception(0x10);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"Could not convert Time(MS) to Time(US)","");
  ConversionException::ConversionException(this,&local_40);
  __cxa_throw(this,&ConversionException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

dtime_t Time::FromTimeMs(int64_t time_ms) {
	int64_t result;
	if (!TryMultiplyOperator::Operation(time_ms, Interval::MICROS_PER_MSEC, result)) {
		throw ConversionException("Could not convert Time(MS) to Time(US)");
	}
	return dtime_t(result);
}